

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.c
# Opt level: O3

input_t inputroutine_protek(tgestate_t *state)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  bVar1 = (*state->speccy->in)(state->speccy,0xf7fe);
  iVar3 = 3;
  if ((bVar1 & 0x10) != 0) {
    bVar1 = (*state->speccy->in)(state->speccy,0xeffe);
    iVar3 = 6;
    if ((bVar1 & 4) != 0) {
      iVar3 = 0;
    }
  }
  bVar1 = (*state->speccy->in)(state->speccy,0xeffe);
  bVar1 = ~bVar1;
  uVar2 = 1;
  if ((bVar1 & 8) == 0) {
    uVar2 = bVar1 >> 3 & 2;
  }
  return (uint)((bVar1 & 1) == 0) * 9 + iVar3 + uVar2;
}

Assistant:

static input_t inputroutine_protek(tgestate_t *state)
{
  uint8_t  keybits_left;       /* was A */
  input_t  left_right;         /* was E */
  uint16_t port;               /* was BC */
  uint8_t  keybits_others;     /* was D */
  input_t  up_down;            /* was A */
  input_t  left_right_up_down; /* was E */
  input_t  fire;               /* was A */

  assert(state != NULL);

  /* Horizontal */
  keybits_left = ~state->speccy->in(state->speccy, port_KEYBOARD_12345);
  left_right = input_LEFT;
  port = port_KEYBOARD_09876;
  if ((keybits_left & (1 << 4)) == 0)
  {
    keybits_left = ~state->speccy->in(state->speccy, port);
    left_right = input_RIGHT;
    if ((keybits_left & (1 << 2)) == 0)
      left_right = 0;
  }

  /* Vertical */
  keybits_others = ~state->speccy->in(state->speccy, port);
  up_down = input_UP;
  if ((keybits_others & (1 << 3)) == 0)
  {
    up_down = input_DOWN;
    if ((keybits_others & (1 << 4)) == 0)
      up_down = input_NONE;
  }

  left_right_up_down = left_right + up_down; /* Combine axis */

  /* Fire */
  fire = input_FIRE;
  if (keybits_others & (1 << 0))
    fire = 0;

  return fire + left_right_up_down; /* Combine axis */
}